

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O3

size_t dictionary_text_get_lexicon(dictionary_t t_dictionary,entry *lexicon)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined8 uVar4;
  size_t sVar5;
  long lVar6;
  text_dictionary_desc *text_dictionary;
  size_t sVar7;
  
  sVar7 = *t_dictionary;
  sVar5 = sVar7;
  if (sVar7 != 0) {
    lVar3 = *(long *)((long)t_dictionary + 0x10);
    lVar6 = 0;
    do {
      puVar1 = (undefined8 *)(lVar3 + lVar6);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)&lexicon->key + lVar6);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      lVar6 = lVar6 + 0x10;
      sVar7 = sVar7 - 1;
    } while (sVar7 != 0);
  }
  return sVar5;
}

Assistant:

size_t dictionary_text_get_lexicon(dictionary_t t_dictionary, entry * lexicon)
{
	text_dictionary_desc * text_dictionary = (text_dictionary_desc *) t_dictionary;

	size_t i;
	for (i = 0; i < text_dictionary->entry_count; i ++)
	{
		lexicon[i].key = text_dictionary->lexicon[i].key;
		lexicon[i].value = text_dictionary->lexicon[i].value;
	}

	return text_dictionary->entry_count;
}